

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiz-stats.c
# Opt level: O2

void stat_grid_counter_simple(chunk_conflict *c,grid_counts *counts)

{
  long lVar1;
  undefined **ppuVar2;
  neighbor_counter_pred *pnVar3;
  byte bVar4;
  grid_counter_pred gpreds [13];
  neighbor_counter_pred npreds [1];
  
  bVar4 = 0;
  memcpy(gpreds,&PTR_square_isfloor_002d0f20,0x138);
  ppuVar2 = &PTR_is_easily_traversed_002d1060;
  pnVar3 = npreds;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pnVar3->pred = (square_predicate_conflict1)*ppuVar2;
    ppuVar2 = ppuVar2 + (ulong)bVar4 * -2 + 1;
    pnVar3 = (neighbor_counter_pred *)((long)pnVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  stat_grid_counter(c,gpreds,L'\r',npreds,L'\x01');
  counts->floor = gpreds[0].in_vault_count;
  counts->upstair = gpreds[1].in_vault_count;
  counts->downstair = gpreds[2].in_vault_count;
  counts->trap = gpreds[3].in_vault_count;
  counts->lava = gpreds[4].in_vault_count;
  counts->impass_rubble = gpreds[5].in_vault_count;
  counts->pass_rubble = gpreds[6].in_vault_count;
  counts->magma_treasure = gpreds[7].in_vault_count;
  counts->quartz_treasure = gpreds[8].in_vault_count;
  counts->open_door = gpreds[9].in_vault_count;
  counts->closed_door = gpreds[10].in_vault_count;
  counts->broken_door = gpreds[0xb].in_vault_count;
  counts->secret_door = gpreds[0xc].in_vault_count;
  for (lVar1 = 4; lVar1 != 0xd; lVar1 = lVar1 + 1) {
    counts->traversable_neighbor_histogram[lVar1 + -4] = npreds[0].vault_histogram[lVar1 + -4];
  }
  counts[1].floor = gpreds[0].in_room_count;
  counts[1].upstair = gpreds[1].in_room_count;
  counts[1].downstair = gpreds[2].in_room_count;
  counts[1].trap = gpreds[3].in_room_count;
  counts[1].lava = gpreds[4].in_room_count;
  counts[1].impass_rubble = gpreds[5].in_room_count;
  counts[1].pass_rubble = gpreds[6].in_room_count;
  counts[1].magma_treasure = gpreds[7].in_room_count;
  counts[1].quartz_treasure = gpreds[8].in_room_count;
  counts[1].open_door = gpreds[9].in_room_count;
  counts[1].closed_door = gpreds[10].in_room_count;
  counts[1].broken_door = gpreds[0xb].in_room_count;
  counts[1].secret_door = gpreds[0xc].in_room_count;
  for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
    counts[1].traversable_neighbor_histogram[lVar1] = npreds[0].room_histogram[lVar1];
  }
  counts[2].floor = gpreds[0].in_other_count;
  counts[2].upstair = gpreds[1].in_other_count;
  counts[2].downstair = gpreds[2].in_other_count;
  counts[2].trap = gpreds[3].in_other_count;
  counts[2].lava = gpreds[4].in_other_count;
  counts[2].impass_rubble = gpreds[5].in_other_count;
  counts[2].pass_rubble = gpreds[6].in_other_count;
  counts[2].magma_treasure = gpreds[7].in_other_count;
  counts[2].quartz_treasure = gpreds[8].in_other_count;
  counts[2].open_door = gpreds[9].in_other_count;
  counts[2].closed_door = gpreds[10].in_other_count;
  counts[2].broken_door = gpreds[0xb].in_other_count;
  counts[2].secret_door = gpreds[0xc].in_other_count;
  for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
    counts[2].traversable_neighbor_histogram[lVar1] = npreds[0].other_histogram[lVar1];
  }
  return;
}

Assistant:

void stat_grid_counter_simple(struct chunk *c, struct grid_counts counts[3])
{
	struct grid_counter_pred gpreds[] = {
		{ square_isfloor, 0, 0, 0 },
		{ square_isupstairs, 0, 0, 0 },
		{ square_isdownstairs, 0, 0, 0 },
		{ is_floor_trap, 0, 0, 0 },
		{ square_isfiery, 0, 0, 0 },
		{ is_impassable_rubble, 0, 0, 0 },
		{ is_passable_rubble, 0, 0, 0 },
		{ is_magma_treasure, 0, 0, 0 },
		{ is_quartz_treasure, 0, 0, 0 },
		{ square_isopendoor, 0, 0, 0 },
		{ square_iscloseddoor, 0, 0, 0 },
		{ square_isbrokendoor, 0, 0, 0 },
		{ square_issecretdoor, 0, 0, 0 },
	};
	struct neighbor_counter_pred npreds[] = {
		{ is_easily_traversed, is_easily_traversed,
			{ 0, 0, 0, 0, 0, 0, 0, 0, 0 },
			{ 0, 0, 0, 0, 0, 0, 0, 0, 0 },
			{ 0, 0, 0, 0, 0, 0, 0, 0, 0 } },
	};
	int i;

	stat_grid_counter(c, gpreds, (int) N_ELEMENTS(gpreds),
		npreds, (int) N_ELEMENTS(npreds));
	counts[0].floor = gpreds[0].in_vault_count;
	counts[0].upstair = gpreds[1].in_vault_count;
	counts[0].downstair = gpreds[2].in_vault_count;
	counts[0].trap = gpreds[3].in_vault_count;
	counts[0].lava = gpreds[4].in_vault_count;
	counts[0].impass_rubble = gpreds[5].in_vault_count;
	counts[0].pass_rubble = gpreds[6].in_vault_count;
	counts[0].magma_treasure = gpreds[7].in_vault_count;
	counts[0].quartz_treasure = gpreds[8].in_vault_count;
	counts[0].open_door = gpreds[9].in_vault_count;
	counts[0].closed_door = gpreds[10].in_vault_count;
	counts[0].broken_door = gpreds[11].in_vault_count;
	counts[0].secret_door = gpreds[12].in_vault_count;
	for (i = 0; i < 9; ++i) {
		counts[0].traversable_neighbor_histogram[i] =
			npreds[0].vault_histogram[i];
	}
	counts[1].floor = gpreds[0].in_room_count;
	counts[1].upstair = gpreds[1].in_room_count;
	counts[1].downstair = gpreds[2].in_room_count;
	counts[1].trap = gpreds[3].in_room_count;
	counts[1].lava = gpreds[4].in_room_count;
	counts[1].impass_rubble = gpreds[5].in_room_count;
	counts[1].pass_rubble = gpreds[6].in_room_count;
	counts[1].magma_treasure = gpreds[7].in_room_count;
	counts[1].quartz_treasure = gpreds[8].in_room_count;
	counts[1].open_door = gpreds[9].in_room_count;
	counts[1].closed_door = gpreds[10].in_room_count;
	counts[1].broken_door = gpreds[11].in_room_count;
	counts[1].secret_door = gpreds[12].in_room_count;
	for (i = 0; i < 9; ++i) {
		counts[1].traversable_neighbor_histogram[i] =
			npreds[0].room_histogram[i];
	}
	counts[2].floor = gpreds[0].in_other_count;
	counts[2].upstair = gpreds[1].in_other_count;
	counts[2].downstair = gpreds[2].in_other_count;
	counts[2].trap = gpreds[3].in_other_count;
	counts[2].lava = gpreds[4].in_other_count;
	counts[2].impass_rubble = gpreds[5].in_other_count;
	counts[2].pass_rubble = gpreds[6].in_other_count;
	counts[2].magma_treasure = gpreds[7].in_other_count;
	counts[2].quartz_treasure = gpreds[8].in_other_count;
	counts[2].open_door = gpreds[9].in_other_count;
	counts[2].closed_door = gpreds[10].in_other_count;
	counts[2].broken_door = gpreds[11].in_other_count;
	counts[2].secret_door = gpreds[12].in_other_count;
	for (i = 0; i < 9; ++i) {
		counts[2].traversable_neighbor_histogram[i] =
			npreds[0].other_histogram[i];
	}
}